

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O3

int amqp_decode_array(amqp_bytes_t encoded,amqp_pool_t *pool,amqp_array_t *output,size_t *offset,
                     int depth)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  void *__ptr;
  void *pvVar6;
  amqp_field_value_t_ *__dest;
  ulong uVar7;
  int iVar8;
  long lVar9;
  
  sVar3 = *offset;
  uVar1 = sVar3 + 4;
  *offset = uVar1;
  iVar4 = -2;
  if (uVar1 <= encoded.len) {
    uVar2 = *(uint *)((long)encoded.bytes + sVar3);
    uVar5 = (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) +
            uVar1;
    if (uVar5 <= encoded.len) {
      __ptr = malloc(0x180);
      if (__ptr == (void *)0x0) {
        iVar4 = -1;
      }
      else {
        uVar7 = 0;
        if (uVar1 < uVar5) {
          iVar8 = 0x10;
          lVar9 = 0;
          uVar7 = 0;
          do {
            pvVar6 = __ptr;
            if ((long)iVar8 <= (long)uVar7) {
              iVar8 = iVar8 * 2;
              pvVar6 = realloc(__ptr,(long)iVar8 * 0x18);
              if (pvVar6 == (void *)0x0) {
                iVar4 = -1;
                goto LAB_0010a315;
              }
            }
            __ptr = pvVar6;
            iVar4 = amqp_decode_field_value
                              (encoded,pool,(amqp_field_value_t *)((long)__ptr + lVar9),offset,depth
                              );
            if (iVar4 < 0) goto LAB_0010a315;
            uVar7 = uVar7 + 1;
            lVar9 = lVar9 + 0x18;
          } while (*offset < uVar5);
        }
        output->num_entries = (int)uVar7;
        sVar3 = (uVar7 & 0xffffffff) * 0x18;
        __dest = (amqp_field_value_t_ *)amqp_pool_alloc(pool,sVar3);
        output->entries = __dest;
        if (__dest == (amqp_field_value_t_ *)0x0) {
          iVar4 = -(uint)((int)uVar7 != 0);
        }
        else {
          memcpy(__dest,__ptr,sVar3);
          iVar4 = 0;
        }
LAB_0010a315:
        free(__ptr);
      }
    }
  }
  return iVar4;
}

Assistant:

static int amqp_decode_array(amqp_bytes_t encoded, amqp_pool_t *pool,
                             amqp_array_t *output, size_t *offset, int depth) {
  uint32_t arraysize;
  int num_entries = 0;
  int allocated_entries = INITIAL_ARRAY_SIZE;
  amqp_field_value_t *entries;
  size_t limit;
  int res;

  if (!amqp_decode_32(encoded, offset, &arraysize)) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  if (arraysize + *offset > encoded.len) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  entries = malloc(allocated_entries * sizeof(amqp_field_value_t));
  if (entries == NULL) {
    return AMQP_STATUS_NO_MEMORY;
  }

  limit = *offset + arraysize;
  while (*offset < limit) {
    if (num_entries >= allocated_entries) {
      void *newentries;
      allocated_entries = allocated_entries * 2;
      newentries =
          realloc(entries, allocated_entries * sizeof(amqp_field_value_t));
      res = AMQP_STATUS_NO_MEMORY;
      if (newentries == NULL) {
        goto out;
      }

      entries = newentries;
    }

    res = amqp_decode_field_value(encoded, pool, &entries[num_entries], offset,
                                  depth);
    if (res < 0) {
      goto out;
    }

    num_entries++;
  }

  output->num_entries = num_entries;
  output->entries =
      amqp_pool_alloc(pool, num_entries * sizeof(amqp_field_value_t));
  /* NULL is legitimate if we requested a zero-length block. */
  if (output->entries == NULL) {
    if (num_entries == 0) {
      res = AMQP_STATUS_OK;
    } else {
      res = AMQP_STATUS_NO_MEMORY;
    }
    goto out;
  }

  memcpy(output->entries, entries, num_entries * sizeof(amqp_field_value_t));
  res = AMQP_STATUS_OK;

out:
  free(entries);
  return res;
}